

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O3

int Fraig_ManCheckMiter(Fraig_Man_t *p)

{
  Fraig_Node_t *pNode;
  int *piVar1;
  long lVar2;
  long lVar3;
  
  if (p->pModel != (int *)0x0) {
    free(p->pModel);
    p->pModel = (int *)0x0;
  }
  lVar2 = (long)p->vOutputs->nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      pNode = p->vOutputs->pArray[lVar3];
      if (pNode != (Fraig_Node_t *)((ulong)p->pConst1 ^ 1)) {
        if (pNode != p->pConst1) {
          piVar1 = Fraig_ManSaveCounterExample(p,pNode);
          p->pModel = piVar1;
          return -(uint)(piVar1 == (int *)0x0);
        }
        piVar1 = Fraig_ManAllocCounterExample(p);
        p->pModel = piVar1;
        return 0;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return 1;
}

Assistant:

int Fraig_ManCheckMiter( Fraig_Man_t * p )
{
    Fraig_Node_t * pNode;
    int i;
    ABC_FREE( p->pModel );
    for ( i = 0; i < p->vOutputs->nSize; i++ )
    {
        // get the output node (it can be complemented!)
        pNode = p->vOutputs->pArray[i];
        // if the miter is constant 0, the problem is UNSAT
        if ( pNode == Fraig_Not(p->pConst1) )
            continue;
        // consider the special case when the miter is constant 1
        if ( pNode == p->pConst1 )
        {
            // in this case, any counter example will do to distinquish it from constant 0
            // here we pick the counter example composed of all zeros
            p->pModel = Fraig_ManAllocCounterExample( p );
            return 0;
        }
        // save the counter example
        p->pModel = Fraig_ManSaveCounterExample( p, pNode );
        // if the model is not found, return undecided
        if ( p->pModel == NULL )
            return -1;
        else
            return 0;
    }
    return 1;
}